

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFLogger.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_339acf::Pl_Track::~Pl_Track(Pl_Track *this)

{
  Pl_Track *this_local;
  
  ~Pl_Track(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

Pl_Track(char const* identifier, Pipeline* next) :
            Pipeline(identifier, next)
        {
            if (!next) {
                throw std::logic_error("Attempt to create Pl_Track with nullptr as next");
            }
        }